

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall
cs_impl::any::holder<std::_Ios_Seekdir>::duplicate(holder<std::_Ios_Seekdir> *this)

{
  holder<std::_Ios_Seekdir> *phVar1;
  _Ios_Seekdir *in_stack_00000008;
  allocator_type<cs_impl::any::holder<std::_Ios_Seekdir>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::_Ios_Seekdir>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::_Ios_Seekdir&>(in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}